

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Namespace *n)

{
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *pvVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> structs;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions;
  pool_ref<soul::AST::Function> *f;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  
  pvVar1 = &(n->super_ModuleBase).structures;
  structs.s = (pvVar1->
              super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  structs.e = (pvVar1->
              super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  generateStructs(this,structs);
  ppVar2 = (n->functions).
           super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (n->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[5])(this,ppVar5->object);
  }
  ppVar3 = (n->super_ModuleBase).structures.
           super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (n->super_ModuleBase).structures.
                super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1) {
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,ppVar6->object);
  }
  ppVar4 = (n->super_ModuleBase).usings.
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = (n->super_ModuleBase).usings.
                super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar4; ppVar7 = ppVar7 + 1) {
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,ppVar7->object);
  }
  functions.s = (n->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  functions.e = (n->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  generateFunctions(this,functions);
  return;
}

Assistant:

void visit (AST::Namespace& n) override
    {
        generateStructs (n.structures);
        for (auto& f : n.functions)   visitObject (f);
        for (auto& s : n.structures)  visitObject (s);
        for (auto& u : n.usings)      visitObject (u);

        generateFunctions (n.functions);
    }